

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

ostream * covenant::operator<<(ostream *o,Rule *r)

{
  Sym s;
  TerminalFactory *this;
  bool bVar1;
  pointer pSVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  TermFactory tfac;
  shared_count local_58;
  string local_50;
  
  if ((r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"e",1);
  }
  else {
    this = (r->_tfac).px;
    local_58.pi_ = (r->_tfac).pn.pi_;
    if (local_58.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_58.pi_)->use_count_ = (local_58.pi_)->use_count_ + 1;
      UNLOCK();
    }
    if (this == (TerminalFactory *)0x0) {
      __assert_fail("tfac",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/CFG.h"
                    ,0xa0,"ostream &covenant::operator<<(ostream &, Rule)");
    }
    pSVar2 = (r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar2) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        s.x = pSVar2[uVar4].x;
        if ((s.x & 1U) == 0) {
          if (this == (TerminalFactory *)0x0) {
            __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                          "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<covenant::TerminalFactory>::operator->() const [T = covenant::TerminalFactory]"
                         );
          }
          TerminalFactory::remap_abi_cxx11_(&local_50,this,(long)(s.x >> 1));
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (o,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        else {
          poVar3 = operator<<(o,s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        }
        pSVar2 = (r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar5 < (ulong)((long)(r->_syms).
                                      super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 2
                               );
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
    boost::detail::shared_count::~shared_count(&local_58);
  }
  return o;
}

Assistant:

ostream& operator<<(ostream& o, Rule r)
    {
      if( r._syms.size() == 0 )
      { 
        o << "e"; 
      } 
      else 
      {
        TermFactory tfac = r.getTermFactory ();
        assert (tfac);
        for( unsigned int i=0; i < r._syms.size(); i++ )
        {
          if (r._syms[i].isVar ())
          {
            o << r._syms[i] << " " ;
          }
          else
          {
            // we apply the dictionary to output the corresponding
            // string.
            o << tfac->remap(r._syms[i].symID ()) << " " ;
          }
        }
      }
      return o;
    }